

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsMainTable.cpp
# Opt level: O0

QList<QRect> * __thiscall
KDReports::MainTable::pageRects(QList<QRect> *__return_storage_ptr__,MainTable *this)

{
  pointer pMVar1;
  MainTable *this_local;
  
  pMVar1 = std::
           unique_ptr<KDReports::MainTablePrivate,_std::default_delete<KDReports::MainTablePrivate>_>
           ::operator->(&this->d);
  (*(pMVar1->m_layout->super_AbstractReportLayout)._vptr_AbstractReportLayout[0xd])();
  pMVar1 = std::
           unique_ptr<KDReports::MainTablePrivate,_std::default_delete<KDReports::MainTablePrivate>_>
           ::operator->(&this->d);
  QList<QRect>::QList(__return_storage_ptr__,&pMVar1->m_layout->m_pageRects);
  return __return_storage_ptr__;
}

Assistant:

QList<QRect> KDReports::MainTable::pageRects() const
{
    d->m_layout->ensureLayouted();
    return d->m_layout->m_pageRects;
}